

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

bool __thiscall soul::AST::ArrayElementRef::isSliceRangeValid(ArrayElementRef *this)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  Expression *pEVar4;
  Constant *pCVar5;
  bool local_109;
  bool local_a9;
  undefined1 local_a8 [8];
  Type type;
  pool_ptr<soul::AST::Constant> c_1;
  Type local_80;
  uint local_64;
  pool_ptr<soul::AST::Constant> local_60;
  pool_ptr<soul::AST::Constant> c;
  int64_t end;
  int64_t start;
  pool_ptr<soul::AST::Expression> local_40 [3];
  byte local_21;
  pool_ptr<soul::AST::Expression> local_20;
  ArrayElementRef *local_18;
  ArrayElementRef *this_local;
  
  local_21 = 0;
  bVar2 = false;
  local_a9 = false;
  local_18 = this;
  if ((this->isSlice & 1U) != 0) {
    local_20.object = (this->object).object;
    local_21 = 1;
    bVar1 = isResolvedAsValue(&local_20);
    local_a9 = false;
    if (bVar1) {
      local_40[0].object = (this->startIndex).object;
      bVar2 = true;
      local_a9 = isResolvedAsValue(local_40);
    }
  }
  if (bVar2) {
    pool_ptr<soul::AST::Expression>::~pool_ptr(local_40);
  }
  if ((local_21 & 1) != 0) {
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_20);
  }
  if (local_a9 == false) {
    this_local._7_1_ = 0;
  }
  else {
    end = 0;
    c.object = (Constant *)0x0;
    pEVar4 = pool_ptr<soul::AST::Expression>::operator->(&this->startIndex);
    (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_60);
    bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_60);
    if (bVar2) {
      pCVar5 = pool_ptr<soul::AST::Constant>::operator->(&local_60);
      end = soul::Value::getAsInt64(&pCVar5->value);
    }
    else {
      this_local._7_1_ = 0;
    }
    local_64 = (uint)!bVar2;
    pool_ptr<soul::AST::Constant>::~pool_ptr(&local_60);
    if (local_64 == 0) {
      bVar2 = pool_ptr<soul::AST::Expression>::operator==(&this->endIndex,(void *)0x0);
      if (bVar2) {
        pEVar4 = pool_ptr<soul::AST::Expression>::operator->(&this->object);
        (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[4])();
        c.object = (Constant *)Type::getArrayOrVectorSize(&local_80);
        Type::~Type(&local_80);
      }
      else {
        pEVar4 = pool_ptr<soul::AST::Expression>::operator->(&this->endIndex);
        uVar3 = (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[3])();
        if ((uVar3 & 1) == 0) {
          this_local._7_1_ = 0;
          goto LAB_00374466;
        }
        c_1.object = (Constant *)(this->endIndex).object;
        bVar2 = isResolvedAsValue((pool_ptr<soul::AST::Expression> *)&c_1);
        checkAssertion(bVar2,"isResolvedAsValue (endIndex)","isSliceRangeValid",0x9c9);
        pool_ptr<soul::AST::Expression>::~pool_ptr((pool_ptr<soul::AST::Expression> *)&c_1);
        pEVar4 = pool_ptr<soul::AST::Expression>::operator->(&this->endIndex);
        (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&type.structure);
        bVar2 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&type.structure);
        if (bVar2) {
          pCVar5 = pool_ptr<soul::AST::Constant>::operator->
                             ((pool_ptr<soul::AST::Constant> *)&type.structure);
          c.object = (Constant *)soul::Value::getAsInt64(&pCVar5->value);
        }
        else {
          this_local._7_1_ = 0;
        }
        local_64 = (uint)!bVar2;
        pool_ptr<soul::AST::Constant>::~pool_ptr((pool_ptr<soul::AST::Constant> *)&type.structure);
        if (local_64 != 0) goto LAB_00374466;
      }
      pEVar4 = pool_ptr<soul::AST::Expression>::operator->(&this->object);
      (*(pEVar4->super_Statement).super_ASTObject._vptr_ASTObject[4])();
      bVar2 = Type::isArrayOrVector((Type *)local_a8);
      local_109 = false;
      if (bVar2) {
        local_109 = Type::isValidArrayOrVectorRange<long>((Type *)local_a8,end,(long)c.object);
      }
      this_local._7_1_ = local_109;
      local_64 = 1;
      Type::~Type((Type *)local_a8);
    }
  }
LAB_00374466:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool isSliceRangeValid() const
        {
            if (isSlice && isResolvedAsValue (object) && isResolvedAsValue (startIndex))
            {
                int64_t start = 0, end = 0;

                if (auto c = startIndex->getAsConstant())
                    start = c->value.getAsInt64();
                else
                    return false;

                if (endIndex == nullptr)
                {
                    end = (int64_t) object->getResultType().getArrayOrVectorSize();
                }
                else
                {
                    if (! endIndex->isResolved())
                        return false;

                    SOUL_ASSERT (isResolvedAsValue (endIndex));

                    if (auto c = endIndex->getAsConstant())
                        end = c->value.getAsInt64();
                    else
                        return false;
                }

                auto type = object->getResultType();
                return type.isArrayOrVector() && type.isValidArrayOrVectorRange (start, end);
            }

            return false;
        }